

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O1

void __thiscall
ExprWriterTest_WriteBinaryLogicalExpr_Test::~ExprWriterTest_WriteBinaryLogicalExpr_Test
          (ExprWriterTest_WriteBinaryLogicalExpr_Test *this)

{
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            (&(this->super_ExprWriterTest).super_ExprFactory);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteBinaryLogicalExpr) {
  auto e1 = MakeRelational(ex::GT, MakeVariable(0), MakeConst(0));
  auto e2 = MakeRelational(ex::LT, MakeVariable(0), MakeConst(10));
  CHECK_WRITE("if x1 > 0 || x1 < 10 then 1",
      MakeIf(MakeBinaryLogical(ex::OR, e1, e2), MakeConst(1), MakeConst(0)));
  CHECK_WRITE("if x1 > 0 && x1 < 10 then 1",
      MakeIf(MakeBinaryLogical(ex::AND, e1, e2), MakeConst(1), MakeConst(0)));
  CHECK_WRITE("if x1 > 0 <==> x1 < 10 then 1",
      MakeIf(MakeBinaryLogical(ex::IFF, e1, e2), MakeConst(1), MakeConst(0)));
}